

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O1

Bool handle_compress(bz_stream *strm)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  byte bVar6;
  int iVar7;
  EState *s;
  bool bVar8;
  bool bVar9;
  bz_stream *pbVar10;
  UChar ch;
  int iVar11;
  uint uVar12;
  bool is_last_block;
  
  s = (EState *)strm->state;
  bVar8 = false;
  bVar9 = false;
LAB_00104ef1:
  do {
    do {
      if (s->state == 1) {
        pbVar10 = s->strm;
        if ((pbVar10->avail_out == 0) || (iVar11 = s->state_out_pos, s->numZ <= iVar11)) {
          bVar6 = 0;
        }
        else {
          do {
            *pbVar10->next_out = s->zbits[iVar11];
            s->state_out_pos = s->state_out_pos + 1;
            pbVar10 = s->strm;
            uVar12 = pbVar10->avail_out - 1;
            pbVar10->avail_out = uVar12;
            pbVar10->next_out = pbVar10->next_out + 1;
            puVar1 = &pbVar10->total_out_lo32;
            *puVar1 = *puVar1 + 1;
            if (*puVar1 == 0) {
              pbVar10->total_out_hi32 = pbVar10->total_out_hi32 + 1;
            }
            bVar6 = 1;
          } while ((uVar12 != 0) && (iVar11 = s->state_out_pos, iVar11 < s->numZ));
        }
        bVar8 = (bool)(bVar8 | bVar6);
        if ((s->state_out_pos < s->numZ) ||
           (((iVar11 = s->mode, iVar11 == 4 && (s->avail_in_expect == 0)) &&
            ((0xff < s->state_in_ch || (s->state_in_len < 1)))))) goto LAB_0010520b;
        s->nblock = 0;
        s->numZ = 0;
        s->state_out_pos = 0;
        s->blockCRC = 0xffffffff;
        memset(s->inUse,0,0x100);
        s->blockNo = s->blockNo + 1;
        s->state = 2;
        if (((iVar11 == 3) && (s->avail_in_expect == 0)) &&
           ((0xff < s->state_in_ch || (s->state_in_len < 1)))) goto LAB_0010520b;
      }
    } while (s->state != 2);
    if (s->mode == 2) {
      iVar11 = s->nblock;
      if ((iVar11 < s->nblockMAX) && (pbVar10 = s->strm, pbVar10->avail_in != 0)) {
        do {
          bVar6 = *pbVar10->next_in;
          uVar12 = s->state_in_ch;
          iVar7 = s->state_in_len;
          if (uVar12 == bVar6) {
            if (iVar7 == 0xff) {
LAB_00105060:
              if (uVar12 < 0x100) {
                add_pair_to_block(s);
              }
              s->state_in_ch = (uint)bVar6;
              s->state_in_len = 1;
            }
            else {
              s->state_in_len = iVar7 + 1;
            }
          }
          else {
            if (iVar7 != 1) goto LAB_00105060;
            s->blockCRC = s->blockCRC << 8 ^ BZ2_crc32Table[uVar12 & 0xff ^ s->blockCRC >> 0x18];
            s->inUse[uVar12] = '\x01';
            s->block[iVar11] = (UChar)uVar12;
            s->nblock = s->nblock + 1;
            s->state_in_ch = (uint)bVar6;
          }
          pbVar10 = s->strm;
          pbVar10->next_in = pbVar10->next_in + 1;
          uVar2 = pbVar10->avail_in;
          uVar4 = pbVar10->total_in_lo32;
          pbVar10->avail_in = uVar2 + -1;
          pbVar10->total_in_lo32 = uVar4 + 1;
          if (uVar4 + 1 == 0) {
            pbVar10->total_in_hi32 = pbVar10->total_in_hi32 + 1;
          }
          iVar11 = s->nblock;
          bVar6 = 1;
        } while ((iVar11 < s->nblockMAX) && (pbVar10 = s->strm, pbVar10->avail_in != 0));
      }
      else {
LAB_001051a8:
        bVar6 = 0;
      }
    }
    else {
      iVar11 = s->nblock;
      if (((s->nblockMAX <= iVar11) || (pbVar10 = s->strm, pbVar10->avail_in == 0)) ||
         (s->avail_in_expect == 0)) goto LAB_001051a8;
      do {
        bVar6 = *pbVar10->next_in;
        uVar12 = s->state_in_ch;
        iVar7 = s->state_in_len;
        if (uVar12 == bVar6) {
          if (iVar7 == 0xff) {
LAB_00105143:
            if (uVar12 < 0x100) {
              add_pair_to_block(s);
            }
            s->state_in_ch = (uint)bVar6;
            s->state_in_len = 1;
          }
          else {
            s->state_in_len = iVar7 + 1;
          }
        }
        else {
          if (iVar7 != 1) goto LAB_00105143;
          s->blockCRC = s->blockCRC << 8 ^ BZ2_crc32Table[uVar12 & 0xff ^ s->blockCRC >> 0x18];
          s->inUse[uVar12] = '\x01';
          s->block[iVar11] = (UChar)uVar12;
          s->nblock = s->nblock + 1;
          s->state_in_ch = (uint)bVar6;
        }
        pbVar10 = s->strm;
        pbVar10->next_in = pbVar10->next_in + 1;
        uVar3 = pbVar10->avail_in;
        uVar5 = pbVar10->total_in_lo32;
        pbVar10->avail_in = uVar3 + -1;
        pbVar10->total_in_lo32 = uVar5 + 1;
        if (uVar5 + 1 == 0) {
          pbVar10->total_in_hi32 = pbVar10->total_in_hi32 + 1;
        }
        s->avail_in_expect = s->avail_in_expect - 1;
        iVar11 = s->nblock;
        bVar6 = 1;
      } while (((iVar11 < s->nblockMAX) && (pbVar10 = s->strm, pbVar10->avail_in != 0)) &&
              (s->avail_in_expect != 0));
    }
    bVar9 = (bool)(bVar9 | bVar6);
    if ((s->mode == 2) || (s->avail_in_expect != 0)) break;
    if (s->state_in_ch < 0x100) {
      add_pair_to_block(s);
    }
    s->state_in_ch = 0x100;
    s->state_in_len = 0;
    is_last_block = s->mode == 4;
LAB_001051f4:
    BZ2_compressBlock(s,is_last_block);
    s->state = 1;
  } while( true );
  if (s->nblockMAX <= s->nblock) {
    is_last_block = false;
    goto LAB_001051f4;
  }
  if (s->strm->avail_in == 0) {
LAB_0010520b:
    return bVar8 || bVar9;
  }
  goto LAB_00104ef1;
}

Assistant:

static
Bool handle_compress ( bz_stream* strm )
{
   Bool progress_in  = False;
   Bool progress_out = False;
   EState* s = strm->state;
   
   while (True) {

      if (s->state == BZ_S_OUTPUT) {
         progress_out |= copy_output_until_stop ( s );
         if (s->state_out_pos < s->numZ) break;
         if (s->mode == BZ_M_FINISHING && 
             s->avail_in_expect == 0 &&
             isempty_RL(s)) break;
         prepare_new_block ( s );
         s->state = BZ_S_INPUT;
         if (s->mode == BZ_M_FLUSHING && 
             s->avail_in_expect == 0 &&
             isempty_RL(s)) break;
      }

      if (s->state == BZ_S_INPUT) {
         progress_in |= copy_input_until_stop ( s );
         if (s->mode != BZ_M_RUNNING && s->avail_in_expect == 0) {
            flush_RL ( s );
            BZ2_compressBlock ( s, (Bool)(s->mode == BZ_M_FINISHING) );
            s->state = BZ_S_OUTPUT;
         }
         else
         if (s->nblock >= s->nblockMAX) {
            BZ2_compressBlock ( s, False );
            s->state = BZ_S_OUTPUT;
         }
         else
         if (s->strm->avail_in == 0) {
            break;
         }
      }

   }

   return progress_in || progress_out;
}